

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

uint __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetMarkCountOnHeapBlockMap
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  char *pcVar1;
  Recycler *pRVar2;
  ushort uVar3;
  uint uVar4;
  char *address;
  bool bVar5;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar4 = 0;
  if (pcVar1 < pcVar1 + 0x1000) {
    pRVar2 = this->heapBucket->heapInfo->recycler;
    uVar4 = 0;
    address = pcVar1;
    do {
      uVar3 = HeapBlockMap64::GetPageMarkCount(&pRVar2->heapBlockMap,address);
      uVar4 = uVar4 + uVar3;
      bVar5 = address < pcVar1;
      address = address + 0x1000;
    } while (bVar5);
  }
  return uVar4;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountOnHeapBlockMap() const
{
    uint heapBlockMapMarkCount = 0;
    char* startPage = this->GetAddress();
    char* endPage = this->GetEndAddress();
    const HeapBlockMap& blockMap = this->GetRecycler()->heapBlockMap;
    for (char* page = startPage; page < endPage; page += AutoSystemInfo::PageSize)
    {
        heapBlockMapMarkCount += blockMap.GetPageMarkCount(page);
    }
    return heapBlockMapMarkCount;
}